

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O0

void __thiscall
pfederc::TypeExpr::TypeExpr
          (TypeExpr *this,Lexer *lexer,Position *pos,
          unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_> *caps,
          Token *tokId,unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *expr)

{
  bool bVar1;
  pointer this_00;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *expr_local;
  Token *tokId_local;
  unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_> *caps_local;
  Position *pos_local;
  Lexer *lexer_local;
  TypeExpr *this_local;
  
  Expr::Expr(&this->super_Expr,lexer,EXPR_TYPE,pos);
  Capable::Capable(&this->super_Capable,caps);
  (this->super_Expr)._vptr_Expr = (_func_int **)&PTR__TypeExpr_0017f8a8;
  this->tokId = tokId;
  std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::unique_ptr(&this->expr,expr);
  if (this->tokId == (Token *)0x0) {
    __assert_fail("this->tokId",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/federlang[P]pfederc/libs/pfederc_syntax/src/expr.cpp"
                  ,0x22b,
                  "pfederc::TypeExpr::TypeExpr(const Lexer &, const Position &, std::unique_ptr<Capabilities> &&, const Token *, std::unique_ptr<Expr> &&)"
                 );
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->expr);
  if (!bVar1) {
    __assert_fail("!!this->expr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/federlang[P]pfederc/libs/pfederc_syntax/src/expr.cpp"
                  ,0x22c,
                  "pfederc::TypeExpr::TypeExpr(const Lexer &, const Position &, std::unique_ptr<Capabilities> &&, const Token *, std::unique_ptr<Expr> &&)"
                 );
  }
  this_00 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator->
                      (&this->expr);
  Expr::setParent(this_00,&this->super_Expr);
  return;
}

Assistant:

TypeExpr::TypeExpr(const Lexer &lexer, const Position &pos,
    std::unique_ptr<Capabilities> &&caps,
    const Token *tokId, std::unique_ptr<Expr> &&expr) noexcept
  : Expr(lexer, ExprType::EXPR_TYPE, pos), Capable(std::move(caps)),
    tokId{tokId}, expr(std::move(expr)) {
  assert(this->tokId);
  assert(!!this->expr);

  this->expr->setParent(this);
}